

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpk_algorithm.c
# Opt level: O2

void fpk_a(void)

{
  long lVar1;
  int i;
  long lVar2;
  long lVar3;
  solver_state_a s;
  
  setup_simple_state_a(&two_dof_robot_a,&s);
  lVar3 = 0;
  lVar1 = 0;
  for (lVar2 = 1; lVar2 <= s.nbody; lVar2 = lVar2 + 1) {
    kca_fpk(_two_dof_robot_c + lVar3 + 0x20,(long)&(s.x_jnt)->target_body + lVar1);
    ga_pose_compose((long)&(s.x_jnt)->target_body + lVar1,_two_dof_robot_c + lVar3,
                    (long)&(s.x_rel)->target_body + lVar1);
    ga_pose_compose((long)&(s.x_rel)->target_body + lVar1,(long)&(s.x_tot)->target_body + lVar1,
                    (long)&s.x_tot[1].target_body + lVar1);
    lVar1 = lVar1 + 0x20;
    lVar3 = lVar3 + 0x60;
  }
  ga_pose_log(s.x_tot + s.nbody);
  return;
}

Assistant:

void fpk_a()
{
    struct kca_kinematic_chain *kc = &two_dof_robot_a;
    struct solver_state_a s;

    setup_simple_state_a(kc, &s);


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kca_joint *joint = &kc->segment[i - 1].joint;

        // Position
        //

        // X_{J,i}
        kca_fpk(joint, &s.x_jnt[i - 1]);

        // i^X_{i-1} = X_{J,i} X_{T,i}
        ga_pose_compose(&s.x_jnt[i - 1], &kc->segment[i - 1].joint_attachment, &s.x_rel[i - 1]);

        // i^X_0 = i^X_{i-1} {i-1}^X_0
        ga_pose_compose(&s.x_rel[i - 1], &s.x_tot[i - 1], &s.x_tot[i]);
    }

    ga_pose_log(&s.x_tot[s.nbody]);
}